

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split_up
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str,char delimiter)

{
  char __c;
  char cVar1;
  char cVar2;
  pointer pcVar3;
  char *pcVar4;
  pointer pbVar5;
  bool bVar6;
  size_type sVar7;
  long *plVar8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  void *pvVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  size_type __pos;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  long lVar13;
  ulong uVar14;
  size_type __size;
  ulong uVar15;
  undefined8 uVar16;
  _Alloc_hider p;
  char *__data;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  int __c_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output;
  string value;
  string delims;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  long *local_c0;
  size_t local_b8;
  long local_b0 [2];
  size_type *local_a0;
  size_type local_98;
  size_type local_90;
  undefined8 uStack_88;
  undefined1 *local_80;
  uint local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char *local_50;
  size_type local_48;
  char local_40;
  undefined1 uStack_3f;
  undefined6 uStack_3e;
  
  local_c0 = local_b0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"\'\"`","");
  local_e0._M_dataplus._M_p = (str->_M_dataplus)._M_p;
  local_100._M_dataplus._M_p = local_e0._M_dataplus._M_p + str->_M_string_length;
  ::std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
            (&local_80);
  str->_M_string_length = (long)local_80 - (long)(str->_M_dataplus)._M_p;
  *local_80 = 0;
  _Var9 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    ();
  pcVar3 = (str->_M_dataplus)._M_p;
  if (pcVar3 + str->_M_string_length == _Var9._M_current) {
    str->_M_string_length = 0;
    *pcVar3 = '\0';
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_erase
              (str,0,(long)_Var9._M_current - (long)pcVar3);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar15 = str->_M_string_length;
  if (uVar15 != 0) {
    local_74 = (uint)(byte)delimiter;
    do {
      plVar8 = local_c0;
      pcVar4 = (str->_M_dataplus)._M_p;
      if (local_b8 == 0) {
LAB_00178111:
        _Var9 = ::std::
                __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::split_up(std::__cxx11::string,char)::_lambda(char)_1_>>
                          (pcVar4,pcVar4 + uVar15,local_74);
        pcVar3 = (str->_M_dataplus)._M_p;
        if (_Var9._M_current == pcVar3 + str->_M_string_length) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,str);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(str,0,str->_M_string_length,"",0);
        }
        else {
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          ::std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)&local_100,pcVar3,_Var9._M_current);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_100);
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          ::std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)&local_e0,_Var9._M_current + 1,
                     (str->_M_dataplus)._M_p + str->_M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (str,&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          uVar16 = local_100.field_2._M_allocated_capacity;
          p._M_p = local_100._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) goto LAB_0017863b;
        }
      }
      else {
        __c = *pcVar4;
        __c_00 = (int)__c;
        pvVar10 = memchr(local_c0,__c_00,local_b8);
        if ((long)pvVar10 - (long)plVar8 == -1 || pvVar10 == (void *)0x0) goto LAB_00178111;
        if ((uVar15 == 1) ||
           (pvVar10 = memchr(pcVar4 + 1,__c_00,uVar15 - 1), pvVar10 == (void *)0x0)) {
LAB_0017826b:
          bVar6 = false;
LAB_00178273:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_100,str,1,0xffffffffffffffff);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(str,0,str->_M_string_length,"",0);
          if (!bVar6) goto LAB_001782e8;
LAB_001783f5:
          paVar17 = &local_70.field_2;
          pbVar5 = (__return_storage_ptr__->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          pcVar3 = pbVar5[-1]._M_dataplus._M_p;
          local_70._M_dataplus._M_p = (pointer)paVar17;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar3,pcVar3 + pbVar5[-1]._M_string_length);
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"\\","");
          pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_replace_aux(&local_e0,local_e0._M_string_length,0,1,__c);
          local_a0 = (size_type *)(pbVar11->_M_dataplus)._M_p;
          paVar12 = &pbVar11->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0 == paVar12) {
            local_90 = paVar12->_M_allocated_capacity;
            uStack_88 = *(undefined8 *)((long)&pbVar11->field_2 + 8);
            local_a0 = &local_90;
          }
          else {
            local_90 = paVar12->_M_allocated_capacity;
          }
          local_98 = pbVar11->_M_string_length;
          (pbVar11->_M_dataplus)._M_p = (pointer)paVar12;
          pbVar11->_M_string_length = 0;
          (pbVar11->field_2)._M_local_buf[0] = '\0';
          local_50 = &local_40;
          local_48 = 1;
          uStack_3f = 0;
          local_40 = __c;
          __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find(&local_70,(char *)local_a0,0,local_98);
          sVar7 = local_70._M_string_length;
          while (__pos != 0xffffffffffffffff) {
            local_70._M_string_length = sVar7;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      (&local_70,__pos,local_98,local_50,local_48);
            __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::find(&local_70,(char *)local_a0,__pos + local_48,local_98);
            sVar7 = local_70._M_string_length;
          }
          local_100._M_dataplus._M_p = local_70._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p == paVar17) {
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          }
          local_100.field_2._M_allocated_capacity._1_7_ =
               local_70.field_2._M_allocated_capacity._1_7_;
          local_100.field_2._M_local_buf[0] = local_70.field_2._M_local_buf[0];
          local_70._M_string_length = 0;
          local_70.field_2._M_local_buf[0] = '\0';
          local_100._M_string_length = sVar7;
          local_70._M_dataplus._M_p = (pointer)paVar17;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((__return_storage_ptr__->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish + -1,&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          if (local_50 != &local_40) {
            operator_delete(local_50,CONCAT62(uStack_3e,CONCAT11(uStack_3f,local_40)) + 1);
          }
          if (local_a0 != &local_90) {
            operator_delete(local_a0,local_90 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p == paVar17) goto LAB_001782e8;
          uVar16 = CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                            local_70.field_2._M_local_buf[0]);
          p._M_p = local_70._M_dataplus._M_p;
LAB_0017863b:
          operator_delete(p._M_p,uVar16 + 1);
        }
        else {
          lVar13 = (long)pvVar10 - (long)pcVar4;
          bVar6 = lVar13 != -1;
          if (lVar13 == -1) goto LAB_0017826b;
          cVar1 = pcVar4[lVar13 + -1];
          cVar2 = cVar1;
          while (cVar2 == '\\') {
            uVar14 = lVar13 + 1;
            if (((uVar15 < uVar14 || uVar15 - uVar14 == 0) ||
                (pvVar10 = memchr(pcVar4 + uVar14,__c_00,uVar15 - uVar14), pvVar10 == (void *)0x0))
               || (lVar13 = (long)pvVar10 - (long)pcVar4, lVar13 == -1)) goto LAB_00178273;
            cVar2 = pcVar4[lVar13 + -1];
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_100,str,1,lVar13 - 1);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          if (lVar13 + 2U < str->_M_string_length) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&local_100,str,lVar13 + 2U,0xffffffffffffffff);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(str,&local_100);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            str->_M_string_length = 0;
            *(str->_M_dataplus)._M_p = '\0';
          }
          if (cVar1 == '\\') goto LAB_001783f5;
        }
      }
LAB_001782e8:
      local_e0._M_dataplus._M_p = (str->_M_dataplus)._M_p;
      local_100._M_dataplus._M_p = local_e0._M_dataplus._M_p + str->_M_string_length;
      ::std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                (&local_80,&local_100,&local_e0);
      str->_M_string_length = (long)local_80 - (long)(str->_M_dataplus)._M_p;
      *local_80 = 0;
      _Var9 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                        ();
      pcVar3 = (str->_M_dataplus)._M_p;
      if (pcVar3 + str->_M_string_length == _Var9._M_current) {
        str->_M_string_length = 0;
        *pcVar3 = '\0';
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_erase
                  (str,0,(long)_Var9._M_current - (long)pcVar3);
      }
      uVar15 = str->_M_string_length;
    } while (uVar15 != 0);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> split_up(std::string str, char delimiter = '\0') {

    const std::string delims("\'\"`");
    auto find_ws = [delimiter](char ch) {
        return (delimiter == '\0') ? (std::isspace<char>(ch, std::locale()) != 0) : (ch == delimiter);
    };
    trim(str);

    std::vector<std::string> output;
    bool embeddedQuote = false;
    char keyChar = ' ';
    while(!str.empty()) {
        if(delims.find_first_of(str[0]) != std::string::npos) {
            keyChar = str[0];
            auto end = str.find_first_of(keyChar, 1);
            while((end != std::string::npos) && (str[end - 1] == '\\')) {  // deal with escaped quotes
                end = str.find_first_of(keyChar, end + 1);
                embeddedQuote = true;
            }
            if(end != std::string::npos) {
                output.push_back(str.substr(1, end - 1));
                if(end + 2 < str.size()) {
                    str = str.substr(end + 2);
                } else {
                    str.clear();
                }

            } else {
                output.push_back(str.substr(1));
                str = "";
            }
        } else {
            auto it = std::find_if(std::begin(str), std::end(str), find_ws);
            if(it != std::end(str)) {
                std::string value = std::string(str.begin(), it);
                output.push_back(value);
                str = std::string(it + 1, str.end());
            } else {
                output.push_back(str);
                str = "";
            }
        }
        // transform any embedded quotes into the regular character
        if(embeddedQuote) {
            output.back() = find_and_replace(output.back(), std::string("\\") + keyChar, std::string(1, keyChar));
            embeddedQuote = false;
        }
        trim(str);
    }
    return output;
}